

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

void __thiscall
wabt::WastLexer::WastLexer
          (WastLexer *this,
          unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *source,
          string_view filename,Errors *errors)

{
  pointer pLVar1;
  char *pcVar2;
  Offset OVar3;
  allocator<char> local_31;
  Errors *local_30;
  Errors *errors_local;
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *source_local;
  WastLexer *this_local;
  string_view filename_local;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (WastLexer *)filename._M_len;
  local_30 = errors;
  errors_local = (Errors *)source;
  source_local = &this->source_;
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::unique_ptr
            (&this->source_,source);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->filename_,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_31);
  std::allocator<char>::~allocator(&local_31);
  this->line_ = 1;
  pLVar1 = std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::operator->
                     (&this->source_);
  pcVar2 = (char *)LexerSource::data(pLVar1);
  this->buffer_ = pcVar2;
  pcVar2 = this->buffer_;
  pLVar1 = std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::operator->
                     (&this->source_);
  OVar3 = LexerSource::size(pLVar1);
  this->buffer_end_ = pcVar2 + OVar3;
  this->line_start_ = this->buffer_;
  this->token_start_ = this->buffer_;
  this->cursor_ = this->buffer_;
  this->errors_ = local_30;
  return;
}

Assistant:

WastLexer::WastLexer(std::unique_ptr<LexerSource> source,
                     std::string_view filename,
                     Errors* errors)
    : source_(std::move(source)),
      filename_(filename),
      line_(1),
      buffer_(static_cast<const char*>(source_->data())),
      buffer_end_(buffer_ + source_->size()),
      line_start_(buffer_),
      token_start_(buffer_),
      cursor_(buffer_),
      errors_(errors) {}